

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

void read_rle_pixel(tga_source_ptr sinfo)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(int *)(in_RDI + 0x68) < 1) {
    iVar1 = *(int *)(in_RDI + 100) + -1;
    *(int *)(in_RDI + 100) = iVar1;
    if (iVar1 < 0) {
      uVar2 = read_byte((tga_source_ptr)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
      if ((uVar2 & 0x80) == 0) {
        *(uint *)(in_RDI + 100) = uVar2 & 0x7f;
      }
      else {
        *(uint *)(in_RDI + 0x68) = uVar2 & 0x7f;
        *(undefined4 *)(in_RDI + 100) = 0;
      }
    }
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x5c); iVar1 = iVar1 + 1) {
      iVar3 = read_byte((tga_source_ptr)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      *(char *)(in_RDI + 0x58 + (long)iVar1) = (char)iVar3;
    }
  }
  else {
    *(int *)(in_RDI + 0x68) = *(int *)(in_RDI + 0x68) + -1;
  }
  return;
}

Assistant:

METHODDEF(void)
read_rle_pixel(tga_source_ptr sinfo)
/* Read one Targa pixel from the input file, expanding RLE data as needed */
{
  register int i;

  /* Duplicate previously read pixel? */
  if (sinfo->dup_pixel_count > 0) {
    sinfo->dup_pixel_count--;
    return;
  }

  /* Time to read RLE block header? */
  if (--sinfo->block_count < 0) { /* decrement pixels remaining in block */
    i = read_byte(sinfo);
    if (i & 0x80) {             /* Start of duplicate-pixel block? */
      sinfo->dup_pixel_count = i & 0x7F; /* number of dups after this one */
      sinfo->block_count = 0;   /* then read new block header */
    } else {
      sinfo->block_count = i & 0x7F; /* number of pixels after this one */
    }
  }

  /* Read next pixel */
  for (i = 0; i < sinfo->pixel_size; i++) {
    sinfo->tga_pixel[i] = (U_CHAR)read_byte(sinfo);
  }
}